

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImGuiID ImHashStr(char *data_p,size_t data_size,ImU32 seed)

{
  byte bVar1;
  ImU32 IVar2;
  uint uVar3;
  uchar c_1;
  uchar c;
  ImU32 *crc32_lut;
  uchar *data;
  ImU32 crc;
  ImU32 seed_local;
  size_t data_size_local;
  char *data_p_local;
  
  uVar3 = seed ^ 0xffffffff;
  crc32_lut = (ImU32 *)data_p;
  data._0_4_ = uVar3;
  _crc = data_size;
  if (data_size == 0) {
    while( true ) {
      bVar1 = (byte)*crc32_lut;
      if (bVar1 == 0) break;
      if (((bVar1 == 0x23) && (*(char *)((long)crc32_lut + 1) == '#')) &&
         (*(char *)((long)crc32_lut + 2) == '#')) {
        data._0_4_ = uVar3;
      }
      crc32_lut = (ImU32 *)((long)crc32_lut + 1);
      data._0_4_ = (uint)data >> 8 ^ GCrc32LookupTable[(uint)data & 0xff ^ (uint)bVar1];
    }
  }
  else {
    while (_crc != 0) {
      IVar2 = *crc32_lut;
      if ((((byte)IVar2 == 0x23) && (1 < _crc - 1)) &&
         ((*(char *)((long)crc32_lut + 1) == '#' && (*(char *)((long)crc32_lut + 2) == '#')))) {
        data._0_4_ = uVar3;
      }
      crc32_lut = (ImU32 *)((long)crc32_lut + 1);
      data._0_4_ = (uint)data >> 8 ^ GCrc32LookupTable[(uint)data & 0xff ^ (uint)(byte)IVar2];
      _crc = _crc - 1;
    }
  }
  return (uint)data ^ 0xffffffff;
}

Assistant:

ImGuiID ImHashStr(const char* data_p, size_t data_size, ImU32 seed)
{
    seed = ~seed;
    ImU32 crc = seed;
    const unsigned char* data = (const unsigned char*)data_p;
    const ImU32* crc32_lut = GCrc32LookupTable;
    if (data_size != 0)
    {
        while (data_size-- != 0)
        {
            unsigned char c = *data++;
            if (c == '#' && data_size >= 2 && data[0] == '#' && data[1] == '#')
                crc = seed;
            crc = (crc >> 8) ^ crc32_lut[(crc & 0xFF) ^ c];
        }
    }
    else
    {
        while (unsigned char c = *data++)
        {
            if (c == '#' && data[0] == '#' && data[1] == '#')
                crc = seed;
            crc = (crc >> 8) ^ crc32_lut[(crc & 0xFF) ^ c];
        }
    }
    return ~crc;
}